

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

bool __thiscall
icu_63::DecimalFormat::fastFormatInt64(DecimalFormat *this,int64_t input,UnicodeString *output)

{
  UnicodeString *output_local;
  int64_t input_local;
  DecimalFormat *this_local;
  
  if ((this->fields->canUseFastFormat & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if ((input < -0x7fffffff) || (0x7fffffff < input)) {
    this_local._7_1_ = false;
  }
  else {
    doFastFormatInt32(this,(int32_t)input,input < 0,output);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalFormat::fastFormatInt64(int64_t input, UnicodeString& output) const {
    if (!fields->canUseFastFormat) {
        return false;
    }
    if (input <= INT32_MIN || input > INT32_MAX) {
        return false;
    }
    doFastFormatInt32(static_cast<int32_t>(input), input < 0, output);
    return true;
}